

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations::AddEnum
          (ForwardDeclarations *this,EnumDescriptor *d)

{
  mapped_type *ppEVar1;
  mapped_type in_RSI;
  EnumDescriptor *in_stack_00000008;
  string local_30 [8];
  key_type *in_stack_ffffffffffffffd8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>_>
  *in_stack_ffffffffffffffe0;
  
  ClassName_abi_cxx11_(in_stack_00000008);
  ppEVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>_>
            ::operator[](in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *ppEVar1 = in_RSI;
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void AddEnum(const EnumDescriptor* d) { enums_[ClassName(d)] = d; }